

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

error_code __thiscall
cinatra::coro_http_client::handle_header
          (coro_http_client *this,resp_data *data,http_parser *parser,size_t header_size)

{
  long lVar1;
  streambuf *psVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  undefined8 uVar6;
  error_code eVar7;
  cerr_logger_t local_31;
  error_category *local_30;
  
  iVar5 = http_parser::parse_response(parser,*(char **)&this->head_buf_->field_0x10,header_size,0);
  if (iVar5 < 0) {
    handle_header();
    uVar6 = 0x47;
  }
  else {
    lVar1 = (this->parser_).body_len_;
    if ((lVar1 < 0) || (this->max_http_body_len_ < lVar1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"invalid http content length: ",0x1d);
      std::ostream::_M_insert<long>((long)&std::cerr);
      cerr_logger_t::~cerr_logger_t(&local_31);
      psVar2 = this->head_buf_;
      uVar3 = *(ulong *)&psVar2->field_0x28;
      if (*(ulong *)&psVar2->field_0x18 < uVar3) {
        *(pointer *)&psVar2->field_0x8 =
             (psVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(ulong *)&psVar2->field_0x18 = uVar3;
      }
      *(long *)&psVar2->field_0x10 =
           *(long *)&psVar2->field_0x10 + (long)((int)uVar3 - (int)*(long *)&psVar2->field_0x10);
      uVar6 = 0x16;
      local_30 = (error_category *)std::_V2::generic_category();
    }
    else {
      psVar2 = this->head_buf_;
      uVar3 = *(ulong *)&psVar2->field_0x28;
      if (*(ulong *)&psVar2->field_0x18 < uVar3) {
        *(pointer *)&psVar2->field_0x8 =
             (psVar2->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(ulong *)&psVar2->field_0x18 = uVar3;
      }
      lVar1 = *(long *)&psVar2->field_0x10;
      iVar5 = (int)uVar3 - (int)lVar1;
      if (lVar1 + header_size <= uVar3) {
        iVar5 = (int)header_size;
      }
      *(long *)&psVar2->field_0x10 = iVar5 + lVar1;
      sVar4 = parser->num_headers_;
      (data->resp_headers)._M_ptr = (parser->headers_)._M_elems;
      (data->resp_headers)._M_extent._M_extent_value = sVar4;
      data->status = parser->status_;
      uVar6 = 0;
      local_30 = (error_category *)std::_V2::system_category();
    }
  }
  eVar7._M_cat = local_30;
  eVar7._0_8_ = uVar6;
  return eVar7;
}

Assistant:

std::error_code handle_header(resp_data &data, http_parser &parser,
                                size_t header_size) {
    // parse header
    const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());

    int parse_ret = parser.parse_response(data_ptr, header_size, 0);
#ifdef INJECT_FOR_HTTP_CLIENT_TEST
    if (parse_failed_forever_) {
      parse_ret = -1;
    }
#endif
    if (parse_ret < 0) [[unlikely]] {
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::protocol_error);
    }

    if (parser_.body_len() > max_http_body_len_ || parser_.body_len() < 0)
        [[unlikely]] {
      CINATRA_LOG_ERROR << "invalid http content length: "
                        << parser_.body_len();
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::invalid_argument);
    }

    head_buf_.consume(header_size);  // header size
    data.resp_headers = parser.get_headers();
    data.status = parser.status();
    return {};
  }